

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O1

string * __thiscall
ymt::GetSSShareLink_abi_cxx11_(string *__return_storage_ptr__,ymt *this,Parser *user)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  string local_1b0;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  ulong local_148;
  long local_140;
  undefined8 uStack_138;
  string local_130;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if (server_addr__abi_cxx11_._M_string_length == 0) {
    util::GetMachineIP_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&server_addr__abi_cxx11_,(string *)&local_190);
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
  }
  if (profile_name__abi_cxx11_._M_string_length == 0) {
    Parser::GetAttribute_abi_cxx11_(&local_f0,(Parser *)this,GROUP_NAME);
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_f0,local_f0._M_string_length,0,'\x01');
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_160 = *puVar5;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *puVar5;
      local_170 = (ulong *)*plVar3;
    }
    local_168 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Parser::GetAttribute_abi_cxx11_(&local_1b0,(Parser *)this,REMOTE_PORT);
    uVar8 = 0xf;
    if (local_170 != &local_160) {
      uVar8 = local_160;
    }
    if (uVar8 < local_1b0._M_string_length + local_168) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        uVar9 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1b0._M_string_length + local_168) goto LAB_001146d6;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_170);
    }
    else {
LAB_001146d6:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_1b0._M_dataplus._M_p)
      ;
    }
    local_190 = &local_180;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_180 = *plVar3;
      lStack_178 = puVar4[3];
    }
    else {
      local_180 = *plVar3;
      local_190 = (long *)*puVar4;
    }
    local_188 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    std::__cxx11::string::operator=((string *)&profile_name__abi_cxx11_,(string *)&local_190);
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  Parser::GetAttribute_abi_cxx11_(&local_50,(Parser *)this,METHOD);
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_50,local_50._M_string_length,0,'\x01');
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_100 = *puVar5;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar5;
    local_110 = (ulong *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Parser::GetAttribute_abi_cxx11_(&local_b0,(Parser *)this,KEY);
  uVar8 = 0xf;
  if (local_110 != &local_100) {
    uVar8 = local_100;
  }
  if (uVar8 < local_b0._M_string_length + local_108) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar9 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_b0._M_string_length + local_108) goto LAB_001148aa;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001148aa:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
  }
  local_150 = &local_140;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_140 = *plVar3;
    uStack_138 = puVar4[3];
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_150,local_148,0,'\x01');
  local_90 = &local_80;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar3[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)server_addr__abi_cxx11_._M_dataplus._M_p);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  paVar1 = &local_1b0.field_2;
  puVar5 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_1b0.field_2._M_allocated_capacity = *puVar5;
    local_1b0.field_2._8_8_ = plVar3[3];
    local_1b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *puVar5;
    local_1b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1b0._M_string_length = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Parser::GetAttribute_abi_cxx11_(&local_d0,(Parser *)this,REMOTE_PORT);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    uVar9 = local_1b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_d0._M_string_length + local_1b0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar9 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_1b0._M_string_length <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
      goto LAB_00114ad4;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_d0._M_dataplus._M_p);
LAB_00114ad4:
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130.field_2._8_8_ = puVar4[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_130._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)psVar7 = 0;
  util::GetEncodedBase64(&local_f0,&local_130);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x117e3d);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_160 = *puVar5;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar5;
    local_170 = (ulong *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_180 = *plVar6;
    lStack_178 = plVar3[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *plVar6;
    local_190 = (long *)*plVar3;
  }
  local_188 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_190,(ulong)profile_name__abi_cxx11_._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ymt::GetSSShareLink(Parser & user) {

	if (server_addr_.empty()) {
		server_addr_ = util::GetMachineIP();
	}

	if (profile_name_.empty()) {
		profile_name_ = user.GetAttribute(GROUP_NAME) + '-' + user.GetAttribute(REMOTE_PORT);
	}

	return "ss://" + util::GetEncodedBase64(user.GetAttribute(METHOD)
											+ ':'
											+ user.GetAttribute(KEY)
											+ '@'
											+ server_addr_
											+ ':'
											+ user.GetAttribute(REMOTE_PORT)) + "#" + profile_name_;
}